

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunnonlinsol_fixedpoint.c
# Opt level: O3

SUNNonlinearSolver
SUNNonlinSol_FixedPointSens(int count,N_Vector y,int m,SUNContext_conflict sunctx)

{
  N_Vector y_00;
  SUNNonlinearSolver p_Var1;
  undefined4 in_register_0000003c;
  
  y_00 = (N_Vector)N_VNew_SensWrapper(CONCAT44(in_register_0000003c,count));
  p_Var1 = SUNNonlinSol_FixedPoint(y_00,m,sunctx);
  N_VDestroy(y_00);
  return p_Var1;
}

Assistant:

SUNNonlinearSolver SUNNonlinSol_FixedPointSens(int count, N_Vector y, int m,
                                               SUNContext sunctx)
{
  SUNFunctionBegin(sunctx);
  SUNNonlinearSolver NLS = NULL;
  N_Vector w             = NULL;

  /* create sensitivity vector wrapper */
  w = N_VNew_SensWrapper(count, y);
  SUNCheckLastErrNull();

  /* create nonlinear solver using sensitivity vector wrapper */
  NLS = SUNNonlinSol_FixedPoint(w, m, sunctx);
  SUNCheckLastErrNull();

  /* free sensitivity vector wrapper */
  N_VDestroy(w);
  SUNCheckLastErrNull();

  /* return NLS object */
  return (NLS);
}